

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

bool GetBrepFormFaceIndex
               (ON_Extrusion *extrusion,int extrusion_profile_index,
               double extrusion_profile_parameter,bool bCountProfileDiscontinuities,
               int *brep_form_face_index,ON_Interval *profile_segment_domain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_Curve *pOVar4;
  undefined7 in_register_00000011;
  int profile_index;
  int iVar5;
  double t1;
  double t0;
  double t;
  double local_68;
  double local_60;
  double local_58;
  undefined4 local_4c;
  double local_48;
  int *local_40;
  ON_Interval *local_38;
  
  local_48 = extrusion_profile_parameter;
  local_40 = brep_form_face_index;
  iVar2 = ON_Extrusion::ProfileCount(extrusion);
  local_60 = -1.23432101234321e+308;
  local_68 = -1.23432101234321e+308;
  local_38 = profile_segment_domain;
  if ((local_48 != -1.23432101234321e+308) || (NAN(local_48))) {
    if (iVar2 < 1) {
      iVar5 = 0;
    }
    else {
      profile_index = 0;
      iVar5 = 0;
      local_4c = (int)CONCAT71(in_register_00000011,bCountProfileDiscontinuities);
      do {
        pOVar4 = ON_Extrusion::Profile(extrusion,profile_index);
        if (pOVar4 == (ON_Curve *)0x0) {
          return false;
        }
        bVar1 = ON_Curve::GetDomain(pOVar4,&local_60,&local_68);
        if (!bVar1) {
          return false;
        }
        bVar1 = ON_IsValid(local_60);
        if (!bVar1) {
          return false;
        }
        bVar1 = ON_IsValid(local_68);
        if (!bVar1) {
          return false;
        }
        if (local_68 <= local_60) {
          return false;
        }
        local_58 = local_68;
        if ((char)local_4c != '\0') {
          while( true ) {
            local_58 = local_68;
            iVar3 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                              (local_60,local_68,0x3feffec097f5af8a,0x3e500000000002c4,pOVar4,0xc,
                               &local_58,0,0);
            if ((((char)iVar3 == '\0') || (local_58 <= local_60)) || (local_68 <= local_58))
            goto LAB_003c98c1;
            if (((profile_index == extrusion_profile_index) && (local_60 <= local_48)) &&
               (local_48 < local_58)) break;
            iVar5 = iVar5 + 1;
            local_60 = local_58;
          }
          local_68 = local_58;
        }
LAB_003c98c1:
        if (profile_index == extrusion_profile_index) break;
        iVar5 = iVar5 + 1;
        profile_index = profile_index + 1;
      } while (profile_index != iVar2);
    }
  }
  else {
    iVar5 = extrusion_profile_index;
    if ((iVar2 != extrusion_profile_index) &&
       (((pOVar4 = ON_Extrusion::Profile(extrusion,extrusion_profile_index),
         pOVar4 == (ON_Curve *)0x0 ||
         (bVar1 = ON_Curve::GetDomain(pOVar4,&local_60,&local_68), !bVar1)) ||
        ((bVar1 = ON_IsValid(local_60), !bVar1 ||
         ((bVar1 = ON_IsValid(local_68), !bVar1 || (local_68 <= local_60)))))))) {
      return false;
    }
  }
  if (local_40 != (int *)0x0) {
    *local_40 = iVar5;
  }
  if (extrusion_profile_index < iVar2 && local_38 != (ON_Interval *)0x0) {
    ON_Interval::Set(local_38,local_60,local_68);
  }
  return true;
}

Assistant:

static bool GetBrepFormFaceIndex(
        const ON_Extrusion& extrusion,
        int extrusion_profile_index,
        double extrusion_profile_parameter,
        bool bCountProfileDiscontinuities,
        int* brep_form_face_index,
        ON_Interval* profile_segment_domain
        )
{
  // When extrusion_profile_index = profile_count,
  // it means the caller is looking for the index of
  // the bottom cap.
  int profile_segment_count = 0;
  const int profile_count = extrusion.ProfileCount();
  double t0 = ON_UNSET_VALUE;
  double t1 = ON_UNSET_VALUE;
  const ON_Curve* profile;
  if ( ON_UNSET_VALUE == extrusion_profile_parameter )
  {
    if ( extrusion_profile_index != profile_count )
    {
      profile = extrusion.Profile(extrusion_profile_index);
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }
    }
    profile_segment_count = extrusion_profile_index;
  }
  else
  {
    for ( int i = 0; i < profile_count; i++ )
    {
      profile = extrusion.Profile(i);
      if ( 0 == profile )
        return false;
      // It is important to use the original profile, "profile_segment"
      // and not the trimmed copy in the GetNextDiscontinuity() loop
      // so the code that creates this brep divides the extrusion profile
      // exactly the same way as the code that calculates component indices.
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }

      double t = t1;
      if ( bCountProfileDiscontinuities )
      {
        while ( GetNextProfileSegmentDiscontinuity(profile,t0,t1,&t) )
        {
          if ( t0 < t && t < t1 )
          {
            if ( i == extrusion_profile_index 
                 && t0 <= extrusion_profile_parameter 
                 && extrusion_profile_parameter < t 
               )
            {
              t1 = t;
              break;
            }
            t0 = t;
            t = t1;
            profile_segment_count++;
            continue;
          }
          break;
        }
      }
      if ( i == extrusion_profile_index )
        break;
      profile_segment_count++;
    }
  }

  if ( 0 != brep_form_face_index )
    *brep_form_face_index = profile_segment_count;

  if ( 0 != profile_segment_domain && extrusion_profile_index < profile_count )
    profile_segment_domain->Set(t0,t1);

  return true;
}